

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_shape(void)

{
  player_shape *ppVar1;
  player_blow *ppVar2;
  player_blow *next_blow;
  player_blow *blow;
  player_shape *next;
  player_shape *shape;
  
  next = shapes;
  while (next != (player_shape *)0x0) {
    next_blow = next->blows;
    ppVar1 = next->next;
    string_free(next->name);
    free_effect(next->effect);
    if (next->breath_name != (char *)0x0) {
      string_free(next->breath_name);
    }
    while (next_blow != (player_blow *)0x0) {
      ppVar2 = next_blow->next;
      string_free(next_blow->name);
      mem_free(next_blow);
      next_blow = ppVar2;
    }
    mem_free(next);
    next = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_shape(void)
{
	struct player_shape *shape = shapes;
	struct player_shape *next;

	while (shape) {
		struct player_blow *blow = shape->blows;
		next = shape->next;
		string_free((char *)shape->name);
		free_effect(shape->effect);
		if (shape->breath_name) {
			string_free((char *)shape->breath_name);
		}
		while (blow) {
			struct player_blow *next_blow = blow->next;
			string_free(blow->name);
			mem_free(blow);
			blow = next_blow;
		}
		mem_free(shape);
		shape = next;
	}
}